

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<long_double>_>::MultiplyByScalar
          (TPZMatrix<Fad<long_double>_> *this,Fad<long_double> *alpha,
          TPZMatrix<Fad<long_double>_> *res)

{
  long *in_RDX;
  undefined8 in_RDI;
  Fad<long_double> *in_stack_ffffffffffffff10;
  Fad<long_double> *in_stack_ffffffffffffff18;
  Fad<long_double> *in_stack_ffffffffffffff20;
  Fad<long_double> *in_stack_ffffffffffffff38;
  TPZFMatrix<Fad<long_double>_> *in_stack_ffffffffffffff40;
  
  (**(code **)(*in_RDX + 0xf8))(in_RDX,in_RDI);
  Fad<long_double>::Fad(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Storage((TPZMatrix<Fad<long_double>_> *)in_stack_ffffffffffffff38);
  TPZFMatrix<Fad<long_double>_>::operator*=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  TPZFMatrixRef<Fad<long_double>_>::~TPZFMatrixRef((TPZFMatrixRef<Fad<long_double>_> *)0x133fde2);
  Fad<long_double>::~Fad(in_stack_ffffffffffffff10);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultiplyByScalar(const TVar alpha, TPZMatrix<TVar>&res) const
{
  res.CopyFrom(this);
  res.Storage() *= alpha;
}